

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

QProcessEnvironment __thiscall
QProcessEnvironmentPrivate::fromList(QProcessEnvironmentPrivate *this,QStringList *list)

{
  char *__file;
  __off_t __length;
  long lVar1;
  QString *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QProcessEnvironment::QProcessEnvironment((QProcessEnvironment *)this);
  this_00 = (list->d).ptr;
  for (lVar1 = (list->d).size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    __file = (char *)QString::indexOf(this_00,(QChar)0x3d,1,CaseSensitive);
    if (0 < (long)__file) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::mid((QString *)&local_58,this_00,(qsizetype)(__file + 1),-1);
      local_70.d = (this_00->d).d;
      local_70.ptr = (this_00->d).ptr;
      local_70.size = (this_00->d).size;
      if (local_70.d != (Data *)0x0) {
        LOCK();
        ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::truncate((QString *)&local_70,__file,__length);
      QProcessEnvironment::insert
                ((QProcessEnvironment *)this,(QString *)&local_70,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    this_00 = this_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSharedDataPointer<QProcessEnvironmentPrivate>)
           (QSharedDataPointer<QProcessEnvironmentPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QProcessEnvironment QProcessEnvironmentPrivate::fromList(const QStringList &list)
{
    QProcessEnvironment env;
    QStringList::ConstIterator it = list.constBegin(),
                              end = list.constEnd();
    for ( ; it != end; ++it) {
        const qsizetype pos = it->indexOf(u'=', 1);
        if (pos < 1)
            continue;

        QString value = it->mid(pos + 1);
        QString name = *it;
        name.truncate(pos);
        env.insert(name, value);
    }
    return env;
}